

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermNode * __thiscall
glslang::HlslParseContext::executeInitializer
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *initializer,TVariable *variable)

{
  TIntermediate *pTVar1;
  TString name;
  TString structName;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TSmallArrayVector *pTVar9;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  TIntermTyped *pTVar10;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  TIntermSymbol *left;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  char *pcVar11;
  undefined4 extraout_var_29;
  TPoolAllocator *pTVar12;
  TPoolAllocator *pTVar13;
  undefined4 extraout_var_30;
  uint uVar14;
  int d;
  char *__end;
  TSourceLoc *pTVar15;
  undefined1 *puVar16;
  undefined1 in_stack_fffffffffffffe80 [24];
  undefined1 *puVar17;
  undefined1 local_150 [16];
  TString local_140;
  TString local_118;
  TString local_f0;
  TType local_c8;
  
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar4));
  uVar14 = *(uint *)(lVar8 + 8);
  TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  TType::shallowCopy(&local_c8,(TType *)CONCAT44(extraout_var_00,iVar4));
  local_c8.qualifier.semanticName = (char *)0x0;
  local_c8.qualifier._16_1_ = local_c8.qualifier._16_1_ & 0xf0;
  local_c8.qualifier.layoutOffset = -1;
  local_c8.qualifier.layoutAlign = -1;
  local_c8.qualifier.layoutPushConstant = false;
  local_c8.qualifier.layoutBufferReference = false;
  local_c8.qualifier.layoutPassthrough = false;
  local_c8.qualifier.layoutViewportRelative = false;
  local_c8.qualifier.layoutSecondaryViewportRelativeOffset = -0x800;
  local_c8.qualifier.layoutBindlessSampler = false;
  local_c8.qualifier.layoutBindlessImage = false;
  local_c8.qualifier.layoutShaderRecord = false;
  local_c8.qualifier.layoutFullQuads = false;
  local_c8.qualifier.layoutQuadDeriv = false;
  local_c8.qualifier.layoutHitObjectShaderRecordNV = false;
  local_c8.qualifier.spirvStorageClass = -1;
  local_c8.qualifier._44_1_ = 0;
  local_c8.qualifier._28_8_ = local_c8.qualifier._28_8_ & 0xffffffdf8000 | 0xffffffff001fcfff;
  local_c8.qualifier._36_8_ = local_c8.qualifier._36_8_ | 0x1ffffff7fffffff;
  local_c8.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
  local_c8.qualifier._8_8_ = local_c8.qualifier._8_8_ & 0x141fff0000;
  iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
  if ((CONCAT44(extraout_var_01,iVar4) != 0) &&
     (iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer),
     *(int *)(CONCAT44(extraout_var_02,iVar4) + 0xb8) == 0)) {
    initializer = convertInitializerList(this,loc,&local_c8,initializer,(TIntermTyped *)0x0);
  }
  uVar14 = uVar14 & 0x7f;
  if (initializer == (TIntermTyped *)0x0) {
    if (uVar14 != 2) {
      return (TIntermNode *)0x0;
    }
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar4) + 0x50))
                      ((long *)CONCAT44(extraout_var_22,iVar4));
    *(byte *)(lVar8 + 8) = *(byte *)(lVar8 + 8) & 0x80;
    return (TIntermNode *)0x0;
  }
  iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0xf0))
                    ((long *)CONCAT44(extraout_var_03,iVar4));
  if (cVar2 != '\0') {
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0xf8))
                      ((long *)CONCAT44(extraout_var_04,iVar4));
    if (cVar2 != '\0') {
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
      iVar5 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x78))
                        ((long *)CONCAT44(extraout_var_06,iVar5));
      pTVar9 = *(TSmallArrayVector **)(CONCAT44(extraout_var_05,iVar4) + 0x60);
      TSmallArrayVector::changeFront(pTVar9,uVar6);
      *(undefined1 *)((long)&pTVar9[1]._vptr_TSmallArrayVector + 4) = 0;
    }
  }
  iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
  lVar8 = *(long *)(CONCAT44(extraout_var_07,iVar4) + 0x60);
  if (((lVar8 != 0) && (lVar8 = *(long *)(lVar8 + 8), lVar8 != 0)) &&
     (1 < (int)((ulong)(*(long *)(lVar8 + 0x10) - *(long *)(lVar8 + 8)) >> 4))) {
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    lVar8 = *(long *)(CONCAT44(extraout_var_08,iVar4) + 0x60);
    if (((lVar8 != 0) && (lVar8 = *(long *)(lVar8 + 8), lVar8 != 0)) &&
       (1 < (int)((ulong)(*(long *)(lVar8 + 0x10) - *(long *)(lVar8 + 8)) >> 4))) {
      iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar4) + 0x98))
                        ((long *)CONCAT44(extraout_var_09,iVar4));
      lVar8 = *(long *)(lVar8 + 8);
      iVar5 = 0;
      iVar4 = 0;
      if (lVar8 != 0) {
        iVar4 = (int)((ulong)(*(long *)(lVar8 + 0x10) - *(long *)(lVar8 + 8)) >> 4);
      }
      iVar7 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar7) + 0x98))
                        ((long *)CONCAT44(extraout_var_10,iVar7));
      lVar8 = *(long *)(lVar8 + 8);
      if (lVar8 != 0) {
        iVar5 = (int)((ulong)(*(long *)(lVar8 + 0x10) - *(long *)(lVar8 + 8)) >> 4);
      }
      if (iVar4 == iVar5) {
        iVar4 = 1;
        while( true ) {
          iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar5) + 0x98))
                            ((long *)CONCAT44(extraout_var_11,iVar5));
          lVar8 = *(long *)(lVar8 + 8);
          if (lVar8 == 0) {
            iVar5 = 0;
          }
          else {
            iVar5 = (int)((ulong)(*(long *)(lVar8 + 0x10) - *(long *)(lVar8 + 8)) >> 4);
          }
          if (iVar5 <= iVar4) break;
          iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          pTVar9 = (TSmallArrayVector *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar5) + 0x98))
                             ((long *)CONCAT44(extraout_var_12,iVar5));
          uVar6 = TSmallArrayVector::getDimSize(pTVar9,iVar4);
          if (uVar6 == 0) {
            iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
            pTVar9 = (TSmallArrayVector *)
                     (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar5) + 0xa0))
                               ((long *)CONCAT44(extraout_var_13,iVar5));
            iVar5 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
            this_00 = (TSmallArrayVector *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar5) + 0x98))
                                ((long *)CONCAT44(extraout_var_14,iVar5));
            uVar6 = TSmallArrayVector::getDimSize(this_00,iVar4);
            TSmallArrayVector::setDimSize(pTVar9,iVar4,uVar6);
          }
          iVar4 = iVar4 + 1;
        }
      }
    }
  }
  if (uVar14 == 2) {
    iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar4) + 0x58))
                      ((long *)CONCAT44(extraout_var_16,iVar4));
    uVar14 = 2;
    if ((*(uint *)(lVar8 + 8) & 0x7f) != 2) {
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_17,iVar4));
      *(ulong *)(lVar8 + 8) = *(ulong *)(lVar8 + 8) & 0xffffffffffffff80 | 0x13;
      uVar14 = 0x13;
    }
  }
  else if (uVar14 == 5) {
    iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar4) + 0x58))
                      ((long *)CONCAT44(extraout_var_15,iVar4));
    if ((*(uint *)(lVar8 + 8) & 0x7f) != 2) {
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pTVar12 = GetThreadPoolAllocator();
      puVar17 = local_150;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &stack0xfffffffffffffe98,"","");
      pTVar13 = GetThreadPoolAllocator();
      puVar16 = &stack0xfffffffffffffe88;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &stack0xfffffffffffffe70,"","");
      name._M_dataplus._M_p = (pointer)&stack0xfffffffffffffe70;
      name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&stack0xfffffffffffffe98;
      name._M_string_length = (size_type)loc;
      name.field_2._M_allocated_capacity = (size_type)pTVar13;
      name.field_2._8_8_ = puVar16;
      structName.field_2._M_allocated_capacity = (size_type)pTVar12;
      structName._M_dataplus.super_allocator_type.allocator =
           (TPoolAllocator *)SUB168(in_stack_fffffffffffffe80._0_16_,0);
      structName._M_dataplus._M_p = (pointer)SUB168(in_stack_fffffffffffffe80._0_16_,8);
      structName._M_string_length = in_stack_fffffffffffffe80._16_8_;
      structName.field_2._8_8_ = puVar17;
      TType::getCompleteString
                (&local_f0,(TType *)CONCAT44(extraout_var_29,iVar4),false,true,true,true,name,
                 structName);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"uniform initializers must be constant","=","\'%s\'",
                 local_f0._M_dataplus._M_p);
      goto LAB_0039687c;
    }
  }
  if ((uVar14 != 5) && (uVar14 != 2)) {
    iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar4) + 0x1d0))
                      ((long *)CONCAT44(extraout_var_23,iVar4));
    if (cVar2 != '\0') {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "can\'t use with types containing arrays sized with a specialization constant",
                 "initializer","");
    }
    left = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc
                     );
    pTVar10 = handleAssign(this,loc,EOpAssign,&left->super_TIntermTyped,initializer);
    if (pTVar10 != (TIntermTyped *)0x0) {
      return &pTVar10->super_TIntermNode;
    }
    TIntermTyped::getCompleteString_abi_cxx11_(&local_118,&left->super_TIntermTyped,false);
    TIntermTyped::getCompleteString_abi_cxx11_(&local_140,initializer,false);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"","=","cannot convert from \'%s\' to \'%s\'",local_140._M_dataplus._M_p,
               local_118._M_dataplus._M_p._0_4_);
    return (TIntermNode *)0x0;
  }
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  pTVar10 = TIntermediate::addConversion
                      (pTVar1,EOpAssign,(TType *)CONCAT44(extraout_var_18,iVar4),initializer);
  if (pTVar10 == (TIntermTyped *)0x0) {
    pTVar10 = (TIntermTyped *)0x0;
  }
  else {
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    iVar5 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar10);
    bVar3 = TType::operator==((TType *)CONCAT44(extraout_var_19,iVar4),
                              (TType *)CONCAT44(extraout_var_20,iVar5));
    if (!bVar3) {
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pTVar10 = TIntermediate::addUniShapeConversion
                          (pTVar1,EOpAssign,(TType *)CONCAT44(extraout_var_21,iVar4),pTVar10);
    }
  }
  if ((pTVar10 != (TIntermTyped *)0x0) &&
     (pTVar15 = loc, iVar4 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[5])(pTVar10),
     CONCAT44(extraout_var_24,iVar4) != 0)) {
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    loc = pTVar15;
    iVar5 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar10);
    bVar3 = TType::operator==((TType *)CONCAT44(extraout_var_25,iVar4),
                              (TType *)CONCAT44(extraout_var_26,iVar5));
    if (bVar3) {
      iVar4 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[5])(pTVar10);
      (*(variable->super_TSymbol)._vptr_TSymbol[0x19])
                (variable,CONCAT44(extraout_var_27,iVar4) + 0xb8);
      return (TIntermNode *)0x0;
    }
  }
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  pcVar11 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_28,iVar4));
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"non-matching or non-convertible constant type for const initializer",pcVar11,
             "");
LAB_0039687c:
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
  lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar4) + 0x50))
                    ((long *)CONCAT44(extraout_var_30,iVar4));
  *(byte *)(lVar8 + 8) = *(byte *)(lVar8 + 8) & 0x80;
  return (TIntermNode *)0x0;
}

Assistant:

TIntermNode* HlslParseContext::executeInitializer(const TSourceLoc& loc, TIntermTyped* initializer, TVariable* variable)
{
    //
    // Identifier must be of type constant, a global, or a temporary, and
    // starting at version 120, desktop allows uniforms to have initializers.
    //
    TStorageQualifier qualifier = variable->getType().getQualifier().storage;

    //
    // If the initializer was from braces { ... }, we convert the whole subtree to a
    // constructor-style subtree, allowing the rest of the code to operate
    // identically for both kinds of initializers.
    //
    //
    // Type can't be deduced from the initializer list, so a skeletal type to
    // follow has to be passed in.  Constness and specialization-constness
    // should be deduced bottom up, not dictated by the skeletal type.
    //
    TType skeletalType;
    skeletalType.shallowCopy(variable->getType());
    skeletalType.getQualifier().makeTemporary();
    if (initializer->getAsAggregate() && initializer->getAsAggregate()->getOp() == EOpNull)
        initializer = convertInitializerList(loc, skeletalType, initializer, nullptr);
    if (initializer == nullptr) {
        // error recovery; don't leave const without constant values
        if (qualifier == EvqConst)
            variable->getWritableType().getQualifier().storage = EvqTemporary;
        return nullptr;
    }

    // Fix outer arrayness if variable is unsized, getting size from the initializer
    if (initializer->getType().isSizedArray() && variable->getType().isUnsizedArray())
        variable->getWritableType().changeOuterArraySize(initializer->getType().getOuterArraySize());

    // Inner arrayness can also get set by an initializer
    if (initializer->getType().isArrayOfArrays() && variable->getType().isArrayOfArrays() &&
        initializer->getType().getArraySizes()->getNumDims() ==
        variable->getType().getArraySizes()->getNumDims()) {
        // adopt unsized sizes from the initializer's sizes
        for (int d = 1; d < variable->getType().getArraySizes()->getNumDims(); ++d) {
            if (variable->getType().getArraySizes()->getDimSize(d) == UnsizedArraySize) {
                variable->getWritableType().getArraySizes()->setDimSize(d,
                    initializer->getType().getArraySizes()->getDimSize(d));
            }
        }
    }

    // Uniform and global consts require a constant initializer
    if (qualifier == EvqUniform && initializer->getType().getQualifier().storage != EvqConst) {
        error(loc, "uniform initializers must be constant", "=", "'%s'", variable->getType().getCompleteString().c_str());
        variable->getWritableType().getQualifier().storage = EvqTemporary;
        return nullptr;
    }

    // Const variables require a constant initializer
    if (qualifier == EvqConst) {
        if (initializer->getType().getQualifier().storage != EvqConst) {
            variable->getWritableType().getQualifier().storage = EvqConstReadOnly;
            qualifier = EvqConstReadOnly;
        }
    }

    if (qualifier == EvqConst || qualifier == EvqUniform) {
        // Compile-time tagging of the variable with its constant value...

        initializer = intermediate.addConversion(EOpAssign, variable->getType(), initializer);
        if (initializer != nullptr && variable->getType() != initializer->getType())
            initializer = intermediate.addUniShapeConversion(EOpAssign, variable->getType(), initializer);
        if (initializer == nullptr || !initializer->getAsConstantUnion() ||
                                      variable->getType() != initializer->getType()) {
            error(loc, "non-matching or non-convertible constant type for const initializer",
                variable->getType().getStorageQualifierString(), "");
            variable->getWritableType().getQualifier().storage = EvqTemporary;
            return nullptr;
        }

        variable->setConstArray(initializer->getAsConstantUnion()->getConstArray());
    } else {
        // normal assigning of a value to a variable...
        specializationCheck(loc, initializer->getType(), "initializer");
        TIntermSymbol* intermSymbol = intermediate.addSymbol(*variable, loc);
        TIntermNode* initNode = handleAssign(loc, EOpAssign, intermSymbol, initializer);
        if (initNode == nullptr)
            assignError(loc, "=", intermSymbol->getCompleteString(), initializer->getCompleteString());
        return initNode;
    }

    return nullptr;
}